

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg6.c
# Opt level: O3

_Bool borg_has_throwable(void)

{
  _Bool _Var1;
  angband_constants *paVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  
  uVar3 = (uint)z_info->pack_size;
  lVar4 = 0xa6;
  uVar5 = 0;
  paVar2 = z_info;
  while (((uVar5 == uVar3 || (borg_items->desc[lVar4 + -0x42] == '\0')) ||
         (_Var1 = flag_has_dbg((bitflag *)(borg_items->desc + lVar4),5,0x25,"borg_items[i].flags",
                               "OF_THROWING"), paVar2 = z_info, !_Var1))) {
    uVar5 = uVar5 + 1;
    uVar3 = (uint)paVar2->pack_size;
    lVar4 = lVar4 + 0x388;
    if (paVar2->quiver_size + uVar3 + 0xc <= uVar5) {
      return false;
    }
  }
  return true;
}

Assistant:

static bool borg_has_throwable(void)
{
    int i;
    for (i = 0; i < QUIVER_END; i++) {
        /* it will show wield in the list */
        /* but not if that is the only thing */
        if (i == INVEN_WIELD)
            continue;

        if (!borg_items[i].iqty)
            continue;

        if (of_has(borg_items[i].flags, OF_THROWING))
            return true;
    }
    return false;
}